

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

float stbir__filter_cubic(float x,float s,void *user_data)

{
  void *user_data_local;
  undefined4 local_10;
  float s_local;
  float x_local;
  
  local_10 = x;
  if (x < 0.0) {
    local_10 = -x;
  }
  if (1.0 <= local_10) {
    if (2.0 <= local_10) {
      s_local = 0.0;
    }
    else {
      s_local = (local_10 * (local_10 * (6.0 - local_10) + -12.0) + 8.0) / 6.0;
    }
  }
  else {
    s_local = (local_10 * local_10 * (local_10 * 3.0 - 6.0) + 4.0) / 6.0;
  }
  return s_local;
}

Assistant:

static float stbir__filter_cubic(float x, float s, void * user_data)
{
  STBIR__UNUSED(s);
  STBIR__UNUSED(user_data);

  if ( x < 0.0f ) x = -x;

  if (x < 1.0f)
    return (4.0f + x*x*(3.0f*x - 6.0f))/6.0f;
  else if (x < 2.0f)
    return (8.0f + x*(-12.0f + x*(6.0f - x)))/6.0f;

  return (0.0f);
}